

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int _imgWidth;
  int _imgHeight;
  int _imgChannel;
  ostream *poVar1;
  uchar *image_00;
  vector<int,_std::allocator<int>_> local_2f8;
  _InputArray local_2d8;
  string local_2c0 [32];
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  Mat local_260 [96];
  undefined1 local_200 [8];
  Mat visualMat;
  uchar *image;
  _OutputArray local_190;
  _InputArray local_178;
  int local_160;
  int local_15c;
  int height;
  int width;
  Mat cvImage;
  uint local_14c;
  long local_148;
  undefined1 local_f8 [8];
  CHog hog;
  CTables tables;
  string local_58 [8];
  string exportPath;
  string local_38 [8];
  string imagePath;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  if (argc != 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"wrong input");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::__cxx11::string::operator=(local_38,argv[1]);
  CTables::CTables((CTables *)&hog.widthStep,NUM_ORI_HALF,NUM_ORI_FULL,CELL_SIZE,true);
  CHog::CHog((CHog *)local_f8);
  cv::imread((string *)&height,(int)local_38);
  if (local_148 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"no such image: ");
    poVar1 = std::operator<<(poVar1,"imagePath");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  _imgWidth = ((int)local_14c / CELL_SIZE) * CELL_SIZE;
  _imgHeight = ((int)_cvImage / CELL_SIZE) * CELL_SIZE;
  local_160 = _imgHeight;
  local_15c = _imgWidth;
  _imgChannel = cv::Mat::channels((Mat *)&height);
  CHog::initialHist((CHog *)local_f8,_imgWidth,_imgHeight,_imgChannel,NUM_ORI_HALF,NUM_ORI_FULL,
                    CELL_SIZE);
  cv::_InputArray::_InputArray(&local_178,(Mat *)&height);
  cv::_OutputArray::_OutputArray(&local_190,(Mat *)&height);
  cv::Size_<int>::Size_((Size_<int> *)&image,local_15c,local_160);
  cv::resize(0,&local_178,&local_190,&image,1);
  cv::_OutputArray::~_OutputArray(&local_190);
  cv::_InputArray::~_InputArray(&local_178);
  printf("width:%d, height:%d\n",(ulong)local_14c,(ulong)_cvImage);
  image_00 = cv::Mat::ptr((Mat *)&height,0);
  CHog::calcDiff((CHog *)local_f8,image_00,(double **)tables.orientationFullTable);
  CHog::calcHist((CHog *)local_f8,tables.orientationHalfTable,(int **)tables._16_8_,
                 (interpItemInt **)tables.interpolationTable,tables.magnitudeTable);
  cv::Mat::Mat(local_260);
  CHog::visualizationFull((CHog *)local_200,(Mat *)local_f8);
  cv::Mat::~Mat(local_260);
  std::__cxx11::string::rfind((char *)local_38,0x10e197);
  std::__cxx11::string::rfind((char *)local_38,0x10e199);
  std::__cxx11::string::rfind((char *)local_38,0x10e197);
  std::__cxx11::string::substr((ulong)local_2c0,(ulong)local_38);
  std::operator+((char *)local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"./");
  std::operator+(local_280,(char *)local_2a0);
  std::__cxx11::string::operator=(local_58,(string *)local_280);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  cv::_InputArray::_InputArray(&local_2d8,(Mat *)local_200);
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_2f8);
  cv::imwrite(local_58,&local_2d8,(vector *)&local_2f8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2f8);
  cv::_InputArray::~_InputArray(&local_2d8);
  cv::Mat::~Mat((Mat *)local_200);
  cv::Mat::~Mat((Mat *)&height);
  CHog::~CHog((CHog *)local_f8);
  CTables::~CTables((CTables *)&hog.widthStep);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	string imagePath;
	string exportPath;
	if(argc==2)
	{
		imagePath = argv[1];
	}
	else
	{
		cout<<"wrong input"<<endl;
		exit(0);
	}
	CTables tables(NUM_ORI_HALF, NUM_ORI_FULL, CELL_SIZE, true);  //建立Look Up Table
	CHog hog;

	cv::Mat cvImage = cv::imread(imagePath);
	if (cvImage.data == NULL)
	{
		cout << "no such image: " << "imagePath" << endl;
		exit(0);
	}
	int width = cvImage.cols/CELL_SIZE*CELL_SIZE;
	int height = cvImage.rows/CELL_SIZE*CELL_SIZE;
	hog.initialHist(width,
			height,
			cvImage.channels(),
			NUM_ORI_HALF,
			NUM_ORI_FULL,
			CELL_SIZE);  //初始化一幅图像的HOG直方图
	cv::resize(cvImage, cvImage, cv::Size(width, height));  //将图像尺寸调整到cell尺寸的整倍数
	printf("width:%d, height:%d\n", cvImage.cols, cvImage.rows);
	unsigned char* image = cvImage.ptr();  //将图像数据传给指针，不知道去除opencv的数据类型是否有助于提升速度

	hog.calcDiff(image, tables.magnitudeTable);
	hog.calcHist(tables.orientationFullTable,
			tables.orientationHalfTable,
			tables.interpolationTableInt,
			tables.weightedBinTable);  //计算HOG直方图

	cv::Mat visualMat = hog.visualizationFull();
	//cv::imshow("hog mat", visualMat);
	//cv::waitKey(0);
	exportPath = "./" + imagePath.substr(imagePath.rfind("/")+1, imagePath.rfind(".") - imagePath.rfind("/") - 1) + "_hog.png";
	cv::imwrite(exportPath, visualMat);
	return 0;
}